

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O3

void ArrayAllocation(bool *result)

{
  long *pointer;
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  TestClass2 *this;
  uint64_t memLeakSize;
  size_t memLeakCount;
  uint64_t local_38;
  uint64_t local_30;
  
  __start(false,"",false);
  __mem_leak_check(&local_30,&local_38,false,"",false);
  if (local_30 == 1) {
    if (local_38 == 400) {
      pointer = (long *)operator_new__(0x5a8);
      *pointer = 0x1e;
      this = (TestClass2 *)(pointer + 1);
      lVar3 = 0;
      do {
        TestClass2::TestClass2(this);
        lVar3 = lVar3 + -0x30;
        this = this + 1;
      } while (lVar3 != -0x5a0);
      __mem_leak_check(&local_30,&local_38,false,"",false);
      if (local_30 != 0x20) {
        uVar1 = 0x6e;
        uVar2 = 0x20;
        goto LAB_001029b9;
      }
      if (local_38 != 0x828) {
        uVar1 = 0x6e;
        uVar2 = 0x828;
        local_30 = local_38;
        goto LAB_001029b9;
      }
      lVar3 = *pointer;
      if (lVar3 != 0) {
        lVar4 = lVar3 * 0x30;
        do {
          TestClass2::~TestClass2((TestClass2 *)((long)pointer + lVar4 + -0x28));
          lVar4 = lVar4 + -0x30;
        } while (lVar4 != 0);
      }
      operator_delete__(pointer,lVar3 * 0x30 + 8);
      __mem_leak_check(&local_30,&local_38,false,"",false);
      if (local_30 != 1) {
        uVar1 = 0x72;
        goto LAB_00102962;
      }
      if (local_38 == 400) {
        __mem_leak_check(&local_30,&local_38,false,"",false);
        if ((local_30 == 0) && (local_30 = local_38, local_38 == 0)) {
          __stop_and_free_all_mem();
          return;
        }
        uVar1 = 0x76;
        uVar2 = 0;
        goto LAB_001029b9;
      }
      uVar1 = 0x72;
      local_30 = local_38;
    }
    else {
      uVar1 = 0x6a;
      local_30 = local_38;
    }
    uVar2 = 400;
  }
  else {
    uVar1 = 0x6a;
LAB_00102962:
    uVar2 = 1;
  }
LAB_001029b9:
  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","ArrayAllocation",uVar1,
         local_30,uVar2);
  *result = false;
  return;
}

Assistant:

TEST_CASE(ArrayAllocation) {

    START_TEST;

    TestClass1* arr1 = new TestClass1[100];

    CHECK_MEM_LEAK(1, 100*sizeof(TestClass1));

    TestClass2* arr2 = new TestClass2[30];

    CHECK_MEM_LEAK(2+30, 100*sizeof(TestClass1) + 30*sizeof(TestClass2) + 30*sizeof(double) + sizeof(void*));

    delete [] arr2;

    CHECK_MEM_LEAK(1, 100*sizeof(TestClass1));

    delete [] arr1;

    CHECK_MEM_LEAK(0, 0);

    STOP_TEST;
}